

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.cc
# Opt level: O2

ostream * absl::lts_20240722::time_internal::cctz::detail::operator<<(ostream *os,civil_month *m)

{
  ostream *poVar1;
  civil_year local_1c0 [2];
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_1c0[0].f_.y = (m->f_).y;
  local_1c0[0].f_.ss = '\0';
  local_1c0[0].f_.m = '\x01';
  local_1c0[0].f_.d = '\x01';
  local_1c0[0].f_.hh = '\0';
  local_1c0[0].f_.mm = '\0';
  poVar1 = operator<<(local_190,local_1c0);
  std::operator<<(poVar1,'-');
  poVar1 = std::operator<<(local_190,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  std::ostream::operator<<((ostream *)poVar1,(int)(m->f_).m);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(os,(string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const civil_month& m) {
  std::stringstream ss;
  ss << civil_year(m) << '-';
  ss << std::setfill('0') << std::setw(2) << m.month();
  return os << ss.str();
}